

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
SModeGameCommand::trigger
          (SModeGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  if (parameters._M_len == 0) {
    pcVar3 = "Error: Too few parameters. Syntax: smode <player-name>";
    uStack_20 = 0x36;
  }
  else {
    lVar1 = RenX::Server::getPlayerByPartName(source,parameters._M_len,parameters._M_str);
    if (lVar1 == 0) {
      pcVar3 = "Error: Player not found.";
      uStack_20 = 0x18;
    }
    else {
      cVar2 = RenX::Server::smodePlayer((PlayerInfo *)source);
      if (cVar2 == '\0') {
        pcVar3 = "Error: Could not set player\'s mode.";
        uStack_20 = 0x23;
      }
      else {
        pcVar3 = "Player\'s mode has been reset.";
        uStack_20 = 0x1d;
      }
    }
  }
  RenX::Server::sendMessage(source,player,uStack_20,pcVar3);
  return;
}

Assistant:

void SModeGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendMessage(*player, "Error: Too few parameters. Syntax: smode <player-name>"sv);
		return;
	}

	RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
	if (target == nullptr) {
		source->sendMessage(*player, "Error: Player not found."sv);
		return;
	}

	if (!source->smodePlayer(*target)) {
		source->sendMessage(*player, "Error: Could not set player's mode."sv);
		return;
	}

	source->sendMessage(*player, "Player's mode has been reset."sv);
}